

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanBlockScalar(Scanner *this,bool IsLiteral)

{
  char *data;
  undefined4 LineBreaks_00;
  uint uVar1;
  bool bVar2;
  StringRef Str_00;
  uint local_21c;
  StringRef local_208;
  string local_1f8;
  StringRef local_1d8;
  undefined1 local_1c8 [8];
  Token T;
  StringRef local_180;
  code *local_170;
  undefined8 local_168;
  iterator local_160;
  iterator LineStart;
  undefined1 local_148 [8];
  SmallString<256U> Str;
  uint LineBreaks;
  uint BlockExitIndent;
  iterator Start;
  uint local_20;
  char local_1a;
  bool IsDone;
  uint BlockIndent;
  char ChompingIndicator;
  bool IsLiteral_local;
  Scanner *this_local;
  
  bVar2 = true;
  if (*this->Current != '|') {
    bVar2 = *this->Current == '>';
  }
  IsDone = IsLiteral;
  _BlockIndent = this;
  if (!bVar2) {
    __assert_fail("*Current == \'|\' || *Current == \'>\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLParser.cpp"
                  ,0x5f5,"bool llvm::yaml::Scanner::scanBlockScalar(bool)");
  }
  skip(this,1);
  Start._7_1_ = 0;
  bVar2 = scanBlockScalarHeader(this,&local_1a,&local_20,(bool *)((long)&Start + 7));
  if (bVar2) {
    if ((Start._7_1_ & 1) == 0) {
      data = this->Current;
      if (this->Indent < 0) {
        local_21c = 0;
      }
      else {
        local_21c = this->Indent;
      }
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfc].buffer
      [0] = (char  [1])(char  [1])(undefined1)local_21c;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfd].buffer
      [0] = (char  [1])(char  [1])local_21c._1_1_;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfe].buffer
      [0] = (char  [1])(char  [1])local_21c._2_1_;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xff].buffer
      [0] = (char  [1])(char  [1])local_21c._3_1_;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf8].buffer
      [0] = (char  [1])0x0;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf9].buffer
      [0] = (char  [1])0x0;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfa].buffer
      [0] = (char  [1])0x0;
      Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfb].buffer
      [0] = (char  [1])0x0;
      if ((local_20 != 0) ||
         (bVar2 = findBlockScalarIndent
                            (this,&local_20,local_21c,
                             (uint *)(Str.super_SmallVector<char,_256U>.
                                      super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8),
                             (bool *)((long)&Start + 7)), bVar2)) {
        SmallString<256U>::SmallString((SmallString<256U> *)local_148);
        while (((Start._7_1_ ^ 0xff) & 1) != 0) {
          bVar2 = scanBlockScalarIndent
                            (this,local_20,
                             Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                             InlineElts._252_4_,(bool *)((long)&Start + 7));
          if (!bVar2) {
            this_local._7_1_ = 0;
            LineStart._0_4_ = 1;
            goto LAB_028a5af6;
          }
          if ((Start._7_1_ & 1) != 0) break;
          local_160 = this->Current;
          local_170 = skip_nb_char;
          local_168 = 0;
          advanceWhile(this,(SkipWhileFunc)skip_nb_char);
          if (local_160 != this->Current) {
            SmallString<256U>::append
                      ((SmallString<256U> *)local_148,
                       (ulong)(uint)Str.super_SmallVector<char,_256U>.
                                    super_SmallVectorStorage<char,_256U>.InlineElts._248_4_,'\n');
            StringRef::StringRef(&local_180,local_160,(long)this->Current - (long)local_160);
            SmallString<256U>::append((SmallString<256U> *)local_148,local_180);
            Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf8].
            buffer[0] = (char  [1])0x0;
            Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf9].
            buffer[0] = (char  [1])0x0;
            Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfa].
            buffer[0] = (char  [1])0x0;
            Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfb].
            buffer[0] = (char  [1])0x0;
          }
          if ((this->Current == this->End) || (bVar2 = consumeLineBreakIfPresent(this), !bVar2))
          break;
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_4_
               = Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
                 _248_4_ + 1;
        }
        if ((this->Current == this->End) &&
           (Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
            _248_4_ == 0)) {
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf8].
          buffer[0] = (char  [1])0x1;
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf9].
          buffer[0] = (char  [1])0x0;
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfa].
          buffer[0] = (char  [1])0x0;
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfb].
          buffer[0] = (char  [1])0x0;
        }
        LineBreaks_00 =
             Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
             _248_4_;
        Str_00 = SmallString::operator_cast_to_StringRef((SmallString *)local_148);
        T.Value.field_2._8_8_ = Str_00.Data;
        uVar1 = getChompedLineBreaks(local_1a,LineBreaks_00,Str_00);
        SmallString<256U>::append((SmallString<256U> *)local_148,(ulong)uVar1,'\n');
        if (this->FlowLevel == 0) {
          this->IsSimpleKeyAllowed = true;
        }
        Token::Token((Token *)local_1c8);
        local_1c8._0_4_ = TK_BlockScalar;
        StringRef::StringRef(&local_1d8,data,(long)this->Current - (long)data);
        T._0_8_ = local_1d8.Data;
        T.Range.Data = (char *)local_1d8.Length;
        local_208 = SmallString<256U>::str((SmallString<256U> *)local_148);
        StringRef::str_abi_cxx11_(&local_1f8,&local_208);
        std::__cxx11::string::operator=((string *)&T.Range.Length,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
        ::push_back(&this->TokenQueue,(Token *)local_1c8);
        this_local._7_1_ = 1;
        LineStart._0_4_ = 1;
        Token::~Token((Token *)local_1c8);
LAB_028a5af6:
        SmallString<256U>::~SmallString((SmallString<256U> *)local_148);
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Scanner::scanBlockScalar(bool IsLiteral) {
  // Eat '|' or '>'
  assert(*Current == '|' || *Current == '>');
  skip(1);

  char ChompingIndicator;
  unsigned BlockIndent;
  bool IsDone = false;
  if (!scanBlockScalarHeader(ChompingIndicator, BlockIndent, IsDone))
    return false;
  if (IsDone)
    return true;

  auto Start = Current;
  unsigned BlockExitIndent = Indent < 0 ? 0 : (unsigned)Indent;
  unsigned LineBreaks = 0;
  if (BlockIndent == 0) {
    if (!findBlockScalarIndent(BlockIndent, BlockExitIndent, LineBreaks,
                               IsDone))
      return false;
  }

  // Scan the block's scalars body.
  SmallString<256> Str;
  while (!IsDone) {
    if (!scanBlockScalarIndent(BlockIndent, BlockExitIndent, IsDone))
      return false;
    if (IsDone)
      break;

    // Parse the current line.
    auto LineStart = Current;
    advanceWhile(&Scanner::skip_nb_char);
    if (LineStart != Current) {
      Str.append(LineBreaks, '\n');
      Str.append(StringRef(LineStart, Current - LineStart));
      LineBreaks = 0;
    }

    // Check for EOF.
    if (Current == End)
      break;

    if (!consumeLineBreakIfPresent())
      break;
    ++LineBreaks;
  }

  if (Current == End && !LineBreaks)
    // Ensure that there is at least one line break before the end of file.
    LineBreaks = 1;
  Str.append(getChompedLineBreaks(ChompingIndicator, LineBreaks, Str), '\n');

  // New lines may start a simple key.
  if (!FlowLevel)
    IsSimpleKeyAllowed = true;

  Token T;
  T.Kind = Token::TK_BlockScalar;
  T.Range = StringRef(Start, Current - Start);
  T.Value = Str.str().str();
  TokenQueue.push_back(T);
  return true;
}